

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68040_move16_pi_al(m68k_info *info)

{
  uint data_00;
  int data [2];
  int modes [2];
  uint local_20;
  uint local_1c;
  int local_18 [2];
  
  data_00 = info->ir;
  local_20 = data_00 & 7;
  local_1c = peek_imm_32(info);
  info->pc = info->pc + 4;
  local_18[0] = 4;
  local_18[1] = 0x11;
  if ((info->type & 0x10) == 0) {
    build_imm(info,0,data_00);
    return;
  }
  build_move16(info,(int *)&local_20,local_18);
  return;
}

Assistant:

static void d68040_move16_pi_al(m68k_info *info)
{
	int data[] = { info->ir & 7, read_imm_32(info) };
	int modes[] = { M68K_AM_REGI_ADDR_POST_INC, M68K_AM_ABSOLUTE_DATA_LONG };

	LIMIT_CPU_TYPES(info, M68040_PLUS);

	build_move16(info, data, modes);
}